

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_mesh * rf_gen_mesh_knot(rf_mesh *__return_storage_ptr__,float radius,float size,int rad_seg,
                          int sides,rf_allocator allocator,rf_allocator temp_allocator)

{
  int iVar1;
  long lVar2;
  float *pfVar3;
  uint uVar4;
  rf_source_location rVar5;
  rf_source_location rVar6;
  rf_source_location rVar7;
  rf_source_location rVar8;
  rf_allocator_args rVar9;
  undefined1 auVar10 [24];
  undefined1 auVar11 [24];
  undefined1 auVar12 [24];
  uint *puVar13;
  par_shapes_mesh *m;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long *in_FS_OFFSET;
  float local_104 [3];
  long lStack_f8;
  undefined4 local_f0;
  uint uStack_ec;
  char *local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  long lStack_c8;
  undefined4 local_c0;
  uint uStack_bc;
  char *local_b8;
  char *pcStack_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  long lStack_98;
  undefined4 local_90;
  uint uStack_8c;
  char *local_88;
  char *pcStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  uint uStack_5c;
  char *local_58;
  char *pcStack_50;
  undefined8 local_48;
  rf_allocator allocator_local;
  
  allocator_local.allocator_proc = allocator.allocator_proc;
  allocator_local.user_data = allocator.user_data;
  __return_storage_ptr__->bone_ids = (int *)0x0;
  __return_storage_ptr__->bone_weights = (float *)0x0;
  __return_storage_ptr__->anim_vertices = (float *)0x0;
  __return_storage_ptr__->anim_normals = (float *)0x0;
  __return_storage_ptr__->colors = (uchar *)0x0;
  __return_storage_ptr__->indices = (unsigned_short *)0x0;
  __return_storage_ptr__->normals = (float *)0x0;
  __return_storage_ptr__->tangents = (float *)0x0;
  __return_storage_ptr__->texcoords = (float *)0x0;
  __return_storage_ptr__->texcoords2 = (float *)0x0;
  __return_storage_ptr__->vertex_count = 0;
  __return_storage_ptr__->triangle_count = 0;
  __return_storage_ptr__->vertices = (float *)0x0;
  *(undefined8 *)&__return_storage_ptr__->vao_id = 0;
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_50 = "rf_gen_mesh_knot";
  local_48 = 0x88ec;
  local_70 = 0;
  uStack_68 = 0x1c;
  local_60 = 0;
  rVar5.proc_name = "rf_gen_mesh_knot";
  rVar5.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar5.line_in_file = 0x88ec;
  rVar9._16_8_ = (ulong)uStack_5c << 0x20;
  rVar9.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x1c) << 0x40,0);
  rVar9.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x1c) << 0x40,8);
  puVar13 = (uint *)(*allocator_local.allocator_proc)(&allocator_local,rVar5,RF_AM_ALLOC,rVar9);
  __return_storage_ptr__->vbo_id = puVar13;
  puVar13[0] = 0;
  puVar13[1] = 0;
  puVar13[2] = 0;
  puVar13[3] = 0;
  puVar13[3] = 0;
  puVar13[4] = 0;
  puVar13[5] = 0;
  puVar13[6] = 0;
  local_104[0] = 3.0;
  if ((radius <= 3.0) && (local_104[0] = radius, radius < 0.5)) {
    local_104[0] = 0.5;
  }
  lVar2 = *in_FS_OFFSET;
  in_FS_OFFSET[-0x86] = (long)temp_allocator.user_data;
  in_FS_OFFSET[-0x85] = (long)temp_allocator.allocator_proc;
  uVar19 = 0;
  if (sides < 3 || rad_seg < 3) {
    m = (par_shapes_mesh *)0x0;
  }
  else {
    if (3.0 < local_104[0]) {
      __assert_fail("radius <= 3.0 && \"Use smaller radius to avoid self-intersection.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                    ,0x600f,"par_shapes_mesh *par_shapes_create_trefoil_knot(int, int, float)");
    }
    if (local_104[0] < 0.5) {
      __assert_fail("radius >= 0.5 && \"Use larger radius to avoid self-intersection.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                    ,0x6010,"par_shapes_mesh *par_shapes_create_trefoil_knot(int, int, float)");
    }
    m = par_shapes_create_parametric(par_shapes__trefoil,rad_seg,sides,local_104);
  }
  par_shapes_scale(m,size,size,size);
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_80 = "rf_gen_mesh_knot";
  local_78 = 0x88f7;
  local_a0 = 0;
  lStack_98 = (long)(m->ntriangles * 9) << 2;
  local_90 = 0;
  rVar6.proc_name = "rf_gen_mesh_knot";
  rVar6.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar6.line_in_file = 0x88f7;
  auVar10._8_8_ = (ulong)uStack_8c << 0x20;
  auVar10._0_8_ = lStack_98;
  auVar10._16_8_ = 0;
  pfVar14 = (float *)(*allocator_local.allocator_proc)
                               (&allocator_local,rVar6,RF_AM_ALLOC,
                                (rf_allocator_args)(auVar10 << 0x40));
  __return_storage_ptr__->vertices = pfVar14;
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_b0 = "rf_gen_mesh_knot";
  local_a8 = 0x88f8;
  local_d0 = 0;
  lStack_c8 = (long)(m->ntriangles * 6) << 2;
  local_c0 = 0;
  rVar7.proc_name = "rf_gen_mesh_knot";
  rVar7.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar7.line_in_file = 0x88f8;
  auVar11._8_8_ = (ulong)uStack_bc << 0x20;
  auVar11._0_8_ = lStack_c8;
  auVar11._16_8_ = 0;
  pfVar15 = (float *)(*allocator_local.allocator_proc)
                               (&allocator_local,rVar7,RF_AM_ALLOC,
                                (rf_allocator_args)(auVar11 << 0x40));
  __return_storage_ptr__->texcoords = pfVar15;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_e0 = "rf_gen_mesh_knot";
  local_d8 = 0x88f9;
  local_104[1] = 0.0;
  local_104[2] = 0.0;
  lStack_f8 = (long)(m->ntriangles * 9) << 2;
  local_f0 = 0;
  rVar8.proc_name = "rf_gen_mesh_knot";
  rVar8.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar8.line_in_file = 0x88f9;
  auVar12._8_8_ = (ulong)uStack_ec << 0x20;
  auVar12._0_8_ = lStack_f8;
  auVar12._16_8_ = 0;
  pfVar16 = (float *)(*allocator_local.allocator_proc)
                               (&allocator_local,rVar8,RF_AM_ALLOC,
                                (rf_allocator_args)(auVar12 << 0x40));
  __return_storage_ptr__->normals = pfVar16;
  iVar1 = m->ntriangles;
  uVar4 = iVar1 * 3;
  __return_storage_ptr__->vertex_count = uVar4;
  __return_storage_ptr__->triangle_count = iVar1;
  uVar17 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar17 = uVar19;
  }
  lVar18 = 2;
  for (; uVar17 != uVar19; uVar19 = uVar19 + 1) {
    pfVar3 = m->points;
    uVar20 = (ulong)m->triangles[uVar19];
    pfVar14[lVar18 + -2] = pfVar3[uVar20 * 3];
    pfVar14[lVar18 + -1] = pfVar3[uVar20 * 3 + 1];
    pfVar14[lVar18] = pfVar3[uVar20 * 3 + 2];
    pfVar3 = m->normals;
    pfVar16[lVar18 + -2] = pfVar3[uVar20 * 3];
    pfVar16[lVar18 + -1] = pfVar3[uVar20 * 3 + 1];
    pfVar16[lVar18] = pfVar3[uVar20 * 3 + 2];
    pfVar3 = m->tcoords;
    pfVar15[uVar19 * 2] = pfVar3[uVar20 * 2];
    pfVar15[uVar19 * 2 + 1] = pfVar3[uVar20 * 2 + 1];
    lVar18 = lVar18 + 3;
  }
  par_shapes_free_mesh(m);
  *(undefined8 *)(lVar2 + -0x430) = 0;
  *(undefined8 *)(lVar2 + -0x428) = 0;
  rf_gfx_load_mesh(__return_storage_ptr__,false);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mesh rf_gen_mesh_knot(float radius, float size, int rad_seg, int sides, rf_allocator allocator, rf_allocator temp_allocator)
{
    rf_mesh mesh = {0};
    mesh.vbo_id = (unsigned int*) RF_ALLOC(allocator, RF_MAX_MESH_VBO * sizeof(unsigned int));
    memset(mesh.vbo_id, 0, RF_MAX_MESH_VBO * sizeof(unsigned int));

    if (radius > 3.0f)      radius = 3.0f;
    else if (radius < 0.5f) radius = 0.5f;

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
    {
        par_shapes_mesh* knot = par_shapes_create_trefoil_knot(rad_seg, sides, radius);
        par_shapes_scale(knot, size, size, size);

        mesh.vertices  = (float*) RF_ALLOC(allocator, knot->ntriangles * 3 * 3 * sizeof(float));
        mesh.texcoords = (float*) RF_ALLOC(allocator, knot->ntriangles * 3 * 2 * sizeof(float));
        mesh.normals   = (float*) RF_ALLOC(allocator, knot->ntriangles * 3 * 3 * sizeof(float));

        mesh.vertex_count   = knot->ntriangles * 3;
        mesh.triangle_count = knot->ntriangles;

        for (rf_int k = 0; k < mesh.vertex_count; k++)
        {
            mesh.vertices[k * 3    ] = knot->points[knot->triangles[k] * 3    ];
            mesh.vertices[k * 3 + 1] = knot->points[knot->triangles[k] * 3 + 1];
            mesh.vertices[k * 3 + 2] = knot->points[knot->triangles[k] * 3 + 2];

            mesh.normals[k * 3    ] = knot->normals[knot->triangles[k] * 3    ];
            mesh.normals[k * 3 + 1] = knot->normals[knot->triangles[k] * 3 + 1];
            mesh.normals[k * 3 + 2] = knot->normals[knot->triangles[k] * 3 + 2];

            mesh.texcoords[k * 2    ] = knot->tcoords[knot->triangles[k] * 2    ];
            mesh.texcoords[k * 2 + 1] = knot->tcoords[knot->triangles[k] * 2 + 1];
        }

        par_shapes_free_mesh(knot);
    }
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

    // Upload vertex data to GPU (static mesh)
    rf_gfx_load_mesh(&mesh, false);

    return mesh;
}